

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall
capnp::JsonCodec::AnnotatedHandler::decode
          (AnnotatedHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  uint32_t uVar1;
  uint uVar2;
  WireValue<uint32_t>_conflict WVar3;
  Reader value;
  Reader value_00;
  WirePointer WVar4;
  WirePointer WVar5;
  Reader *pRVar6;
  RemoveConst<capnp::json::Value::Field::Reader> *pRVar7;
  Reader *pRVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  ListElementCount LVar12;
  Entry *pEVar13;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *pRVar14;
  Entry *pEVar15;
  HashBucket *pHVar16;
  bool bVar17;
  ushort uVar18;
  WirePointer WVar19;
  long lVar20;
  Reader *__begin3;
  WirePointer WVar21;
  size_t sVar22;
  ElementCount index;
  long lVar23;
  StringPtr SVar24;
  Reader field;
  DebugExpression<bool> _kjCondition;
  HashSet<const_void_*> unionsSeen;
  Vector<capnp::json::Value::Field::Reader> local_1c8;
  WirePointer local_1a8;
  WirePointer local_1a0;
  undefined1 local_198 [24];
  WirePointer WStack_180;
  StructDataBitCount local_178;
  ushort uStack_174;
  undefined2 uStack_172;
  WireValue<uint32_t>_conflict WStack_170;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_16c;
  AnnotatedHandler *local_160;
  JsonCodec *local_158;
  WirePointer local_150;
  ListReader local_148;
  WirePointer local_118;
  undefined8 uStack_110;
  HashSet<const_void_*> local_108;
  WirePointer local_c0;
  PointerReader local_b8;
  StructReader local_90;
  StructReader local_60;
  
  local_160 = this;
  local_158 = codec;
  if (input._reader.dataSize < 0x10) {
    local_148.segment = (SegmentReader *)((ulong)local_148.segment._1_7_ << 8);
  }
  else {
    local_148.segment = (SegmentReader *)CONCAT71(local_148.segment._1_7_,*input._reader.data == 5);
    if (*input._reader.data == 5) {
      WVar21.offsetAndKind.value = 0;
      WVar21.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      local_108.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .rows.builder.endPtr = (Entry *)0x0;
      local_108.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .rows.builder.ptr = (Entry *)0x0;
      local_108.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .rows.builder.pos =
           (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)0x0;
      local_108.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .rows.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
      local_108.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .indexes.erasedCount = 0;
      local_108.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .indexes.buckets.ptr = (HashBucket *)0x0;
      local_108.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .indexes.buckets.size_ = 0;
      local_108.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .indexes.buckets.disposer = (ArrayDisposer *)0x0;
      local_1c8.builder.endPtr = (Reader *)0x0;
      local_1c8.builder.ptr = (Reader *)0x0;
      local_1c8.builder.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
      local_1c8.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
      local_198._16_8_ = input._reader.pointers;
      if (input._reader.pointerCount == 0) {
        local_198._16_8_ = WVar21;
      }
      local_198._0_8_ = (SegmentReader *)0x0;
      local_198._8_8_ = (CapTableReader *)0x0;
      WVar3.value = 0x7fffffff;
      if (input._reader.pointerCount != 0) {
        local_198._0_8_ = input._reader.segment;
        local_198._8_8_ = input._reader.capTable;
        WVar3.value = input._reader.nestingLimit;
      }
      WStack_180.offsetAndKind.value = WVar3.value;
      capnp::_::PointerReader::getList
                (&local_148,(PointerReader *)local_198,INLINE_COMPOSITE,(word *)0x0);
      LVar12 = local_148.elementCount;
      if (local_148.elementCount != 0) {
        WVar19.offsetAndKind.value = 0;
        WVar19.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        index = 0;
        do {
          capnp::_::ListReader::getStructElement((StructReader *)local_198,&local_148,index);
          local_b8.nestingLimit = (int)WStack_170;
          local_b8.pointer = (WirePointer *)WStack_180;
          if (uStack_174 == 0) {
            local_b8.nestingLimit = 0x7fffffff;
            local_b8.pointer = (WirePointer *)WVar19;
          }
          local_b8.segment = (SegmentReader *)0x0;
          local_b8.capTable = (CapTableReader *)0x0;
          if (uStack_174 != 0) {
            local_b8.segment = (SegmentReader *)local_198._0_8_;
            local_b8.capTable = (CapTableReader *)local_198._8_8_;
          }
          SVar24.content =
               (ArrayPtr<const_char>)
               capnp::_::PointerReader::getBlob<capnp::Text>(&local_b8,(void *)0x0,0);
          local_b8.pointer = (WirePointer *)((long)WStack_180 + 8);
          if (uStack_174 < 2) {
            local_b8.segment = (SegmentReader *)0x0;
            local_b8.capTable = (CapTableReader *)0x0;
            local_b8.nestingLimit = 0x7fffffff;
            local_b8.pointer = (WirePointer *)WVar19;
          }
          else {
            local_b8.segment = (SegmentReader *)local_198._0_8_;
            local_b8.capTable = (CapTableReader *)local_198._8_8_;
            local_b8.nestingLimit = (int)WStack_170;
          }
          capnp::_::PointerReader::getStruct(&local_60,&local_b8,(word *)0x0);
          value._reader.capTable = local_60.capTable;
          value._reader.segment = local_60.segment;
          value._reader.data = local_60.data;
          value._reader.pointers = local_60.pointers;
          value._reader.dataSize = local_60.dataSize;
          value._reader.pointerCount = local_60.pointerCount;
          value._reader._38_2_ = local_60._38_2_;
          value._reader.nestingLimit = local_60.nestingLimit;
          value._reader._44_4_ = local_60._44_4_;
          bVar17 = decodeField(local_160,local_158,SVar24,value,output,&local_108);
          if (!bVar17) {
            if (local_1c8.builder.pos == local_1c8.builder.endPtr) {
              sVar22 = ((long)local_1c8.builder.pos - (long)local_1c8.builder.ptr >> 4) *
                       0x5555555555555556;
              if (local_1c8.builder.pos == local_1c8.builder.ptr) {
                sVar22 = 4;
              }
              kj::Vector<capnp::json::Value::Field::Reader>::setCapacity(&local_1c8,sVar22);
            }
            auVar10 = local_198._0_16_;
            WVar4.field_1.upper32Bits._0_2_ = uStack_174;
            WVar4.offsetAndKind.value = local_178;
            WVar4.field_1.structRef.ptrCount.value =
                 (WireValue<WirePointerCount16>)(WireValue<WirePointerCount16>)uStack_172;
            WVar5.field_1.upper32Bits = aStack_16c.upper32Bits;
            WVar5.offsetAndKind.value = WStack_170.value;
            *(WirePointer *)((long)local_1c8.builder.pos + 0x20) = WVar4;
            *(WirePointer *)((long)local_1c8.builder.pos + 0x28) = WVar5;
            *(WireValue<uint32_t>_conflict *)&((local_1c8.builder.pos)->_reader).data =
                 (WireValue<uint32_t>_conflict)local_198._16_4_;
            *(undefined4 *)((long)&((local_1c8.builder.pos)->_reader).data + 4) = local_198._20_4_;
            *(WirePointer *)((long)local_1c8.builder.pos + 0x18) = WStack_180;
            *(undefined8 *)local_1c8.builder.pos = local_198._0_8_;
            *(WireValue<uint32_t>_conflict *)&((local_1c8.builder.pos)->_reader).capTable =
                 (WireValue<uint32_t>_conflict)local_198._8_4_;
            *(undefined4 *)((long)&((local_1c8.builder.pos)->_reader).capTable + 4) =
                 local_198._12_4_;
            local_1c8.builder.pos =
                 (RemoveConst<capnp::json::Value::Field::Reader> *)
                 ((long)local_1c8.builder.pos + 0x30);
            local_198._0_16_ = auVar10;
          }
          index = index + 1;
        } while (LVar12 != index);
      }
      do {
        pRVar7 = local_1c8.builder.pos;
        WVar21 = (WirePointer)local_1c8.builder.ptr;
        if (local_1c8.builder.pos == local_1c8.builder.ptr) break;
        local_198._8_8_ = local_1c8.builder.pos;
        local_198._0_8_ = local_1c8.builder.ptr;
        local_198._16_8_ = local_1c8.builder.endPtr;
        WStack_180 = (WirePointer)local_1c8.builder.disposer;
        local_1c8.builder.ptr = (Reader *)0x0;
        local_1c8.builder.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
        local_1c8.builder.endPtr = (Reader *)0x0;
        local_c0 = (WirePointer)pRVar7;
        do {
          local_1a0 = *(WirePointer *)WVar21;
          WVar19 = *(WirePointer *)((long)WVar21 + 8);
          local_150 = *(WirePointer *)((long)WVar21 + 0x10);
          local_1a8 = *(WirePointer *)((long)WVar21 + 0x18);
          uVar1 = ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)WVar21 + 0x24))->upper32Bits;
          local_118 = *(WirePointer *)((long)WVar21 + 0x28);
          uVar18 = (ushort)uVar1;
          uStack_110 = 0;
          if (uVar18 == 0) {
            local_148.elementCount = 0x7fffffff;
            local_148.capTable._0_4_ = 0;
            local_148.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            local_148.ptr._0_4_ = 0;
            local_148.ptr._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            local_148.segment._0_4_ = 0;
            local_148.segment._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          }
          else {
            local_148.elementCount = (ListElementCount)local_118.offsetAndKind.value;
            local_148.capTable = (CapTableReader *)WVar19;
            local_148.ptr = (byte *)local_1a8;
            local_148.segment = (SegmentReader *)local_1a0;
          }
          uVar2 = (((WirePointer *)((long)WVar21 + 0x20))->offsetAndKind).value;
          SVar24.content =
               (ArrayPtr<const_char>)
               capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_148,(void *)0x0,0);
          if (uVar18 < 2) {
            local_148.elementCount = 0x7fffffff;
            local_148.capTable._0_4_ = 0;
            local_148.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            local_148.ptr = (byte *)0x0;
            local_148.segment._0_4_ = 0;
            local_148.segment._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          }
          else {
            local_148.ptr = (byte *)((long)local_1a8 + 8);
            local_148.capTable = (CapTableReader *)WVar19;
            local_148.segment = (SegmentReader *)local_1a0;
            local_148.elementCount = local_118.offsetAndKind.value;
          }
          capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)&local_148,(word *)0x0);
          value_00._reader.capTable = local_90.capTable;
          value_00._reader.segment = local_90.segment;
          value_00._reader.data = local_90.data;
          value_00._reader.pointers = local_90.pointers;
          value_00._reader.dataSize = local_90.dataSize;
          value_00._reader.pointerCount = local_90.pointerCount;
          value_00._reader._38_2_ = local_90._38_2_;
          value_00._reader.nestingLimit = local_90.nestingLimit;
          value_00._reader._44_4_ = local_90._44_4_;
          bVar17 = decodeField(local_160,local_158,SVar24,value_00,output,&local_108);
          if (!bVar17) {
            if (local_1c8.builder.pos == local_1c8.builder.endPtr) {
              sVar22 = ((long)local_1c8.builder.pos - (long)local_1c8.builder.ptr >> 4) *
                       0x5555555555555556;
              if (local_1c8.builder.pos == local_1c8.builder.ptr) {
                sVar22 = 4;
              }
              kj::Vector<capnp::json::Value::Field::Reader>::setCapacity(&local_1c8,sVar22);
            }
            *(WirePointer *)local_1c8.builder.pos = local_1a0;
            *(WirePointer *)((long)local_1c8.builder.pos + 8) = WVar19;
            *(WirePointer *)((long)local_1c8.builder.pos + 0x10) = local_150;
            *(WirePointer *)((long)local_1c8.builder.pos + 0x18) = local_1a8;
            (((WirePointer *)((long)local_1c8.builder.pos + 0x20))->offsetAndKind).value = uVar2;
            ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_1c8.builder.pos + 0x24))->
            upper32Bits = uVar1;
            *(WirePointer *)((long)local_1c8.builder.pos + 0x28) = local_118;
            local_1c8.builder.pos =
                 (RemoveConst<capnp::json::Value::Field::Reader> *)
                 ((long)local_1c8.builder.pos + 0x30);
          }
          uVar11 = local_198._16_8_;
          WVar21 = (WirePointer)((long)WVar21 + 0x30);
        } while (WVar21 != local_c0);
        uVar9 = local_198._0_8_;
        lVar23 = (long)local_1c8.builder.pos - (long)local_1c8.builder.ptr;
        lVar20 = local_198._8_8_ - local_198._0_8_;
        if ((SegmentReader *)local_198._0_8_ != (SegmentReader *)0x0) {
          local_198._0_16_ = (undefined1  [16])0x0;
          local_198._16_4_ = 0;
          local_198._20_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          (*(code *)**(undefined8 **)WStack_180)
                    (WStack_180,uVar9,0x30,(lVar20 >> 4) * -0x5555555555555555,
                     ((long)(uVar11 - uVar9) >> 4) * -0x5555555555555555,0);
        }
      } while (lVar23 != lVar20);
      pRVar8 = local_1c8.builder.endPtr;
      pRVar7 = local_1c8.builder.pos;
      pRVar6 = local_1c8.builder.ptr;
      if ((WirePointer)local_1c8.builder.ptr != (WirePointer)0x0) {
        local_1c8.builder.ptr = (Reader *)0x0;
        local_1c8.builder.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
        local_1c8.builder.endPtr = (Reader *)0x0;
        (*(code *)*(local_1c8.builder.disposer)->_vptr_ArrayDisposer)
                  (local_1c8.builder.disposer,pRVar6,0x30,
                   ((long)pRVar7 - (long)pRVar6 >> 4) * -0x5555555555555555,
                   ((long)pRVar8 - (long)pRVar6 >> 4) * -0x5555555555555555,0);
      }
      sVar22 = local_108.
               super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
               .indexes.buckets.size_;
      pHVar16 = local_108.
                super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
                .indexes.buckets.ptr;
      if (local_108.
          super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
          .indexes.buckets.ptr != (HashBucket *)0x0) {
        local_108.
        super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
        .indexes.buckets.ptr = (HashBucket *)0x0;
        local_108.
        super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
        .indexes.buckets.size_ = 0;
        (**(local_108.
            super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
            .indexes.buckets.disposer)->_vptr_ArrayDisposer)
                  (local_108.
                   super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
                   .indexes.buckets.disposer,pHVar16,8,sVar22,sVar22,0);
      }
      pEVar15 = local_108.
                super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
                .rows.builder.endPtr;
      pEVar13 = local_108.
                super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
                .rows.builder.ptr;
      if (local_108.
          super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
          .rows.builder.ptr != (Entry *)0x0) {
        pRVar14 = local_108.
                  super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
                  .rows.builder.pos;
        local_108.
        super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
        .rows.builder.ptr = (Entry *)0x0;
        local_108.
        super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
        .rows.builder.pos =
             (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)0x0;
        local_108.
        super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
        .rows.builder.endPtr = (Entry *)0x0;
        (**(local_108.
            super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
            .rows.builder.disposer)->_vptr_ArrayDisposer)
                  (local_108.
                   super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
                   .rows.builder.disposer,pEVar13,8,(long)pRVar14 - (long)pEVar13 >> 3,
                   (long)pEVar15 - (long)pEVar13 >> 3,0);
      }
      return;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x47e,FAILED,"input.isObject()","_kjCondition,",(DebugExpression<bool> *)&local_148);
  kj::_::Debug::Fault::fatal((Fault *)&local_108);
}

Assistant:

void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    KJ_REQUIRE(input.isObject());
    kj::HashSet<const void*> unionsSeen;
    kj::Vector<JsonValue::Field::Reader> retries;
    for (auto field: input.getObject()) {
      if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
        retries.add(field);
      }
    }
    while (!retries.empty()) {
      auto retriesCopy = kj::mv(retries);
      KJ_ASSERT(retries.empty());
      for (auto field: retriesCopy) {
        if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
          retries.add(field);
        }
      }
      if (retries.size() == retriesCopy.size()) {
        // We made no progress in this iteration. Give up on the remaining fields.
        break;
      }
    }
  }